

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strnterminate_s.c
# Opt level: O2

rsize_t strnterminate_s(char *dest,rsize_t dmax)

{
  long lVar1;
  errno_t error;
  rsize_t rVar2;
  rsize_t rVar3;
  char *msg;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    rVar2 = 0;
  }
  else {
    if (dmax == 0) {
      msg = "strnterminate_s: dmax is 0";
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        for (rVar3 = 0;
            (rVar2 = dmax - 1, dmax - 1 != rVar3 && (rVar2 = rVar3, dest[rVar3] != '\0'));
            rVar3 = rVar3 + 1) {
        }
        dest[rVar2] = '\0';
        goto LAB_001061d7;
      }
      msg = "strnterminate_s: dmax exceeds max";
      error = 0x193;
    }
    rVar2 = 0;
    invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
  }
LAB_001061d7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return rVar2;
}

Assistant:

rsize_t
strnterminate_s (char *dest, rsize_t dmax)
{
    rsize_t count;

    if (dest == NULL) {
        return (0);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strnterminate_s: dmax is 0",
                   NULL, ESZEROL);
        return (0);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strnterminate_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (0);
    }

    count = 0;
    while (dmax > 1) {
        if (*dest) {
            count++;
            dmax--;
            dest++;
        } else {
            break;
        }
    }
    *dest = '\0';

    return (count);
}